

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_haxe_generator.cc
# Opt level: O0

void __thiscall
t_haxe_generator::generate_serialize_container
          (t_haxe_generator *this,ostream *out,t_type *ttype,string *prefix)

{
  uint uVar1;
  t_type *ptVar2;
  ostream *poVar3;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  allocator local_189;
  string local_188;
  undefined1 local_168 [8];
  string iter;
  string local_128;
  string local_108;
  string local_e8;
  allocator local_c1;
  string local_c0;
  undefined1 local_a0 [8];
  string counter;
  allocator local_69;
  string local_68;
  undefined1 local_48 [8];
  string iter_1;
  string *prefix_local;
  t_type *ttype_local;
  ostream *out_local;
  t_haxe_generator *this_local;
  
  iter_1.field_2._8_8_ = prefix;
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  uVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])();
  if ((uVar1 & 1) == 0) {
    uVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])();
    if ((uVar1 & 1) == 0) {
      uVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])();
      if ((uVar1 & 1) != 0) {
        poVar3 = t_generator::indent((t_generator *)this,out);
        poVar3 = std::operator<<(poVar3,"oprot.writeListBegin(new TList(");
        ptVar2 = t_list::get_elem_type((t_list *)ttype);
        type_to_enum_abi_cxx11_((string *)(iter.field_2._M_local_buf + 8),this,ptVar2);
        poVar3 = std::operator<<(poVar3,(string *)(iter.field_2._M_local_buf + 8));
        poVar3 = std::operator<<(poVar3,", ");
        poVar3 = std::operator<<(poVar3,(string *)prefix);
        poVar3 = std::operator<<(poVar3,".length));");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)(iter.field_2._M_local_buf + 8));
      }
    }
    else {
      poVar3 = t_generator::indent((t_generator *)this,out);
      poVar3 = std::operator<<(poVar3,"oprot.writeSetBegin(new TSet(");
      ptVar2 = t_set::get_elem_type((t_set *)ttype);
      type_to_enum_abi_cxx11_(&local_128,this,ptVar2);
      poVar3 = std::operator<<(poVar3,(string *)&local_128);
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = std::operator<<(poVar3,(string *)prefix);
      poVar3 = std::operator<<(poVar3,".size));");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_128);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_68,"_key",&local_69);
    t_generator::tmp((string *)local_48,(t_generator *)this,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c0,"_sizeCounter",&local_c1);
    t_generator::tmp((string *)local_a0,(t_generator *)this,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"var ");
    poVar3 = std::operator<<(poVar3,(string *)local_a0);
    poVar3 = std::operator<<(poVar3," : Int = 0;");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"for( ");
    poVar3 = std::operator<<(poVar3,(string *)local_48);
    poVar3 = std::operator<<(poVar3," in ");
    poVar3 = std::operator<<(poVar3,(string *)prefix);
    poVar3 = std::operator<<(poVar3,") {");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"  ");
    poVar3 = std::operator<<(poVar3,(string *)local_a0);
    poVar3 = std::operator<<(poVar3,"++;");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"}");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"oprot.writeMapBegin(new TMap(");
    ptVar2 = t_map::get_key_type((t_map *)ttype);
    type_to_enum_abi_cxx11_(&local_e8,this,ptVar2);
    poVar3 = std::operator<<(poVar3,(string *)&local_e8);
    poVar3 = std::operator<<(poVar3,", ");
    ptVar2 = t_map::get_val_type((t_map *)ttype);
    type_to_enum_abi_cxx11_(&local_108,this,ptVar2);
    poVar3 = std::operator<<(poVar3,(string *)&local_108);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = std::operator<<(poVar3,(string *)local_a0);
    poVar3 = std::operator<<(poVar3,"));");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)local_a0);
    std::__cxx11::string::~string((string *)local_48);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_188,"elem",&local_189);
  t_generator::tmp((string *)local_168,(t_generator *)this,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  uVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])();
  if ((uVar1 & 1) == 0) {
    uVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])();
    if ((uVar1 & 1) == 0) {
      uVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])();
      if ((uVar1 & 1) != 0) {
        poVar3 = t_generator::indent((t_generator *)this,out);
        poVar3 = std::operator<<(poVar3,"for( ");
        poVar3 = std::operator<<(poVar3,(string *)local_168);
        poVar3 = std::operator<<(poVar3," in ");
        poVar3 = std::operator<<(poVar3,(string *)prefix);
        poVar3 = std::operator<<(poVar3,")");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      }
    }
    else {
      poVar3 = t_generator::indent((t_generator *)this,out);
      poVar3 = std::operator<<(poVar3,"for( ");
      poVar3 = std::operator<<(poVar3,(string *)local_168);
      poVar3 = std::operator<<(poVar3," in ");
      poVar3 = std::operator<<(poVar3,(string *)prefix);
      poVar3 = std::operator<<(poVar3,".toArray())");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    }
  }
  else {
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"for( ");
    poVar3 = std::operator<<(poVar3,(string *)local_168);
    poVar3 = std::operator<<(poVar3," in ");
    poVar3 = std::operator<<(poVar3,(string *)prefix);
    poVar3 = std::operator<<(poVar3,".keys())");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  }
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  uVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])();
  if ((uVar1 & 1) == 0) {
    uVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])();
    if ((uVar1 & 1) == 0) {
      uVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])();
      if ((uVar1 & 1) != 0) {
        std::__cxx11::string::string((string *)&local_210,(string *)local_168);
        generate_serialize_list_element(this,out,(t_list *)ttype,&local_210);
        std::__cxx11::string::~string((string *)&local_210);
      }
    }
    else {
      std::__cxx11::string::string((string *)&local_1f0,(string *)local_168);
      generate_serialize_set_element(this,out,(t_set *)ttype,&local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_1b0,(string *)local_168);
    std::__cxx11::string::string((string *)&local_1d0,(string *)prefix);
    generate_serialize_map_element(this,out,(t_map *)ttype,&local_1b0,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1b0);
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  uVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])();
  if ((uVar1 & 1) == 0) {
    uVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])();
    if ((uVar1 & 1) == 0) {
      uVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])();
      if ((uVar1 & 1) != 0) {
        poVar3 = t_generator::indent((t_generator *)this,out);
        poVar3 = std::operator<<(poVar3,"oprot.writeListEnd();");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      }
    }
    else {
      poVar3 = t_generator::indent((t_generator *)this,out);
      poVar3 = std::operator<<(poVar3,"oprot.writeSetEnd();");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    }
  }
  else {
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"oprot.writeMapEnd();");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  std::__cxx11::string::~string((string *)local_168);
  return;
}

Assistant:

void t_haxe_generator::generate_serialize_container(ostream& out, t_type* ttype, string prefix) {
  scope_up(out);

  if (ttype->is_map()) {
    string iter = tmp("_key");
    string counter = tmp("_sizeCounter");
    indent(out) << "var " << counter << " : Int = 0;" << endl;
    indent(out) << "for( " << iter << " in " << prefix << ") {" << endl;
    indent(out) << "  " << counter << +"++;" << endl;
    indent(out) << "}" << endl;

    indent(out) << "oprot.writeMapBegin(new TMap(" << type_to_enum(((t_map*)ttype)->get_key_type())
                << ", " << type_to_enum(((t_map*)ttype)->get_val_type()) << ", " << counter << "));"
                << endl;
  } else if (ttype->is_set()) {
    indent(out) << "oprot.writeSetBegin(new TSet(" << type_to_enum(((t_set*)ttype)->get_elem_type())
                << ", " << prefix << ".size));" << endl;
  } else if (ttype->is_list()) {
    indent(out) << "oprot.writeListBegin(new TList("
                << type_to_enum(((t_list*)ttype)->get_elem_type()) << ", " << prefix << ".length));"
                << endl;
  }

  string iter = tmp("elem");
  if (ttype->is_map()) {
    indent(out) << "for( " << iter << " in " << prefix << ".keys())" << endl;
  } else if (ttype->is_set()) {
    indent(out) << "for( " << iter << " in " << prefix << ".toArray())" << endl;
  } else if (ttype->is_list()) {
    indent(out) << "for( " << iter << " in " << prefix << ")" << endl;
  }

  scope_up(out);

  if (ttype->is_map()) {
    generate_serialize_map_element(out, (t_map*)ttype, iter, prefix);
  } else if (ttype->is_set()) {
    generate_serialize_set_element(out, (t_set*)ttype, iter);
  } else if (ttype->is_list()) {
    generate_serialize_list_element(out, (t_list*)ttype, iter);
  }

  scope_down(out);

  if (ttype->is_map()) {
    indent(out) << "oprot.writeMapEnd();" << endl;
  } else if (ttype->is_set()) {
    indent(out) << "oprot.writeSetEnd();" << endl;
  } else if (ttype->is_list()) {
    indent(out) << "oprot.writeListEnd();" << endl;
  }

  scope_down(out);
}